

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QTzTransitionTime>::relocate
          (QArrayDataPointer<QTzTransitionTime> *this,qsizetype offset,QTzTransitionTime **data)

{
  bool bVar1;
  QTzTransitionTime *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  QTzTransitionTime *res;
  
  first = (QTzTransitionTime *)(*(long *)(in_RDI + 8) + in_RSI * 0x10);
  QtPrivate::q_relocate_overlap_n<QTzTransitionTime,long_long>
            (first,in_RDI,(QTzTransitionTime *)0x7610d7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QTzTransitionTime>,QTzTransitionTime_const*>
                        (data,(QArrayDataPointer<QTzTransitionTime> *)res), bVar1)) {
    *in_RDX = in_RSI * 0x10 + *in_RDX;
  }
  *(QTzTransitionTime **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }